

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::FdConnectionReceiver::accept
          (FdConnectionReceiver *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint in_register_00000034;
  OwnedFileDescriptor local_18;
  FdConnectionReceiver *this_local;
  
  local_18.flags = in_register_00000034;
  local_18.fd = __fd;
  this_local = this;
  acceptImpl((FdConnectionReceiver *)&stack0xffffffffffffffe0,SUB41(__fd,0));
  Promise<kj::AuthenticatedStream>::
  then<kj::(anonymous_namespace)::FdConnectionReceiver::accept()::_lambda(kj::AuthenticatedStream&&)_1_>
            ((Promise<kj::AuthenticatedStream> *)this,(Type *)&stack0xffffffffffffffe0);
  Promise<kj::AuthenticatedStream>::~Promise
            ((Promise<kj::AuthenticatedStream> *)&stack0xffffffffffffffe0);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> accept() override {
    return acceptImpl(false).then([](AuthenticatedStream&& a) { return kj::mv(a.stream); });
  }